

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void arm::display_cond(ConditionCode cond,ostream *o)

{
  if (cond < Always) {
    std::operator<<(o,&DAT_001955a0 + *(int *)(&DAT_001955a0 + (ulong)cond * 4));
    return;
  }
  return;
}

Assistant:

void display_cond(ConditionCode cond, std::ostream &o) {
  switch (cond) {
    case ConditionCode::Equal:
      o << "eq";
      break;
    case ConditionCode::NotEqual:
      o << "ne";
      break;
    case ConditionCode::CarrySet:
      o << "cs";
      break;
    case ConditionCode::CarryClear:
      o << "cc";
      break;
    case ConditionCode::UnsignedGe:
      o << "hs";
      break;
    case ConditionCode::UnsignedLe:
      o << "ls";
      break;
    case ConditionCode::UnsignedGt:
      o << "hi";
      break;
    case ConditionCode::UnsignedLt:
      o << "lo";
      break;
    case ConditionCode::MinusOrNegative:
      o << "mn";
      break;
    case ConditionCode::PositiveOrZero:
      o << "pl";
      break;
    case ConditionCode::Overflow:
      o << "vs";
      break;
    case ConditionCode::NoOverflow:
      o << "vc";
      break;
    case ConditionCode::Ge:
      o << "ge";
      break;
    case ConditionCode::Lt:
      o << "lt";
      break;
    case ConditionCode::Gt:
      o << "gt";
      break;
    case ConditionCode::Le:
      o << "le";
      break;
    case ConditionCode::Always:
      // AL is default
      break;
  }
}